

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Network.cpp
# Opt level: O3

void __thiscall Network::add(Network *this,Synapse *n_synapse)

{
  pointer *pppSVar1;
  vector<Population_*,_std::allocator<Population_*>_> *this_00;
  pointer *pppPVar2;
  iterator __position;
  Population **ppPVar3;
  iterator __position_00;
  Synapse *local_18;
  
  __position._M_current =
       (this->synapses).super__Vector_base<Synapse_*,_std::allocator<Synapse_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_18 = n_synapse;
  if (__position._M_current ==
      (this->synapses).super__Vector_base<Synapse_*,_std::allocator<Synapse_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<Synapse*,std::allocator<Synapse*>>::_M_realloc_insert<Synapse*const&>
              ((vector<Synapse*,std::allocator<Synapse*>> *)this,__position,&local_18);
  }
  else {
    *__position._M_current = n_synapse;
    pppSVar1 = &(this->synapses).super__Vector_base<Synapse_*,_std::allocator<Synapse_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
    *pppSVar1 = *pppSVar1 + 1;
  }
  this_00 = &this->populations;
  __position_00._M_current =
       (this->populations).super__Vector_base<Population_*,_std::allocator<Population_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  for (ppPVar3 = (this->populations).super__Vector_base<Population_*,_std::allocator<Population_*>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppPVar3 != __position_00._M_current;
      ppPVar3 = ppPVar3 + 1) {
    if (*ppPVar3 == local_18->from_population) goto LAB_0010bd48;
  }
  if (__position_00._M_current ==
      (this->populations).super__Vector_base<Population_*,_std::allocator<Population_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<Population*,std::allocator<Population*>>::_M_realloc_insert<Population*const&>
              ((vector<Population*,std::allocator<Population*>> *)this_00,__position_00,
               &local_18->from_population);
    __position_00._M_current =
         (this->populations).super__Vector_base<Population_*,_std::allocator<Population_*>_>._M_impl
         .super__Vector_impl_data._M_finish;
  }
  else {
    *__position_00._M_current = local_18->from_population;
    __position_00._M_current =
         (this->populations).super__Vector_base<Population_*,_std::allocator<Population_*>_>._M_impl
         .super__Vector_impl_data._M_finish + 1;
    (this->populations).super__Vector_base<Population_*,_std::allocator<Population_*>_>._M_impl.
    super__Vector_impl_data._M_finish = __position_00._M_current;
  }
LAB_0010bd48:
  ppPVar3 = (this_00->super__Vector_base<Population_*,_std::allocator<Population_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  while( true ) {
    if (ppPVar3 == __position_00._M_current) {
      if (__position_00._M_current ==
          (this->populations).super__Vector_base<Population_*,_std::allocator<Population_*>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<Population*,std::allocator<Population*>>::_M_realloc_insert<Population*const&>
                  ((vector<Population*,std::allocator<Population*>> *)this_00,__position_00,
                   &local_18->to_population);
      }
      else {
        *__position_00._M_current = local_18->to_population;
        pppPVar2 = &(this->populations).
                    super__Vector_base<Population_*,_std::allocator<Population_*>_>._M_impl.
                    super__Vector_impl_data._M_finish;
        *pppPVar2 = *pppPVar2 + 1;
      }
      return;
    }
    if (*ppPVar3 == local_18->to_population) break;
    ppPVar3 = ppPVar3 + 1;
  }
  return;
}

Assistant:

void Network::add(Synapse* n_synapse) {
    synapses.push_back(n_synapse);
    if(!networkContainsPopulation(n_synapse->from_population))
        populations.push_back(n_synapse->from_population);
    if(!networkContainsPopulation(n_synapse->to_population))
        populations.push_back(n_synapse->to_population);
}